

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2plus.hpp
# Opt level: O2

bool trng::operator==(status_type *a,status_type *b)

{
  result_type_conflict *prVar1;
  result_type_conflict *prVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  if (a->index != b->index) {
    return false;
  }
  uVar4 = 0;
  do {
    uVar3 = lagfib2plus<unsigned_int,_168U,_521U>::status_type::size();
    bVar5 = uVar3 <= uVar4;
    if (bVar5) {
      return bVar5;
    }
    prVar1 = a->r + uVar4;
    prVar2 = b->r + uVar4;
    uVar4 = uVar4 + 1;
  } while (*prVar1 == *prVar2);
  return bVar5;
}

Assistant:

bool operator==(const status_type &a, const status_type &b) {
        if (a.index != b.index)
          return false;
        for (unsigned int i{0}; i < a.size(); ++i)
          if (a.r[i] != b.r[i])
            return false;
        return true;
      }